

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O1

void __thiscall MxxColl_GatherOne_Test::~MxxColl_GatherOne_Test(MxxColl_GatherOne_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, GatherOne) {
    mxx::comm c;
    std::pair<int,double> x = std::make_pair(13*c.rank(), 3.141/c.rank());
    // gather to process 0
    std::vector<std::pair<int, double> > pairs = mxx::gather(x, 0);

    if (c.rank() == 0) {
        ASSERT_EQ(c.size(), (int)pairs.size());
        for (int i = 0; i < c.size(); ++i)
        {
            ASSERT_EQ(13*i, pairs[i].first);
            ASSERT_EQ(3.141/i, pairs[i].second);
        }
    } else {
        ASSERT_EQ(0, (int)pairs.size());
    }
}